

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
PDA::getCFGVariables_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PDA *this)

{
  pointer pbVar1;
  State *pSVar2;
  pointer pcVar3;
  bool bVar4;
  long *plVar5;
  long *plVar6;
  size_type *psVar7;
  pointer pbVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string inputX;
  string variableName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  pointer local_118;
  PDA *local_110;
  pointer local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  string local_c0;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  pointer local_80;
  pointer local_78;
  State *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_110 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"S","");
  __l._M_len = 1;
  __l._M_array = &local_138;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,(allocator_type *)&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_118 = (local_110->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_80 = (local_110->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_118 != local_80) {
    do {
      local_108 = (local_110->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
      local_78 = (local_110->statesQ).super__Vector_base<State_*,_std::allocator<State_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_108 != local_78) {
        local_70 = *local_118;
        do {
          pbVar8 = (local_110->stackAlphabetG).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (local_110->stackAlphabetG).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar8 != pbVar1) {
            pSVar2 = *local_108;
            do {
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              pcVar3 = (pbVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_138,pcVar3,pcVar3 + pbVar8->_M_string_length);
              std::operator+(&local_68,"[",&local_70->name);
              plVar5 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_68,(ulong)local_138._M_dataplus._M_p);
              local_e0 = &local_d0;
              plVar6 = plVar5 + 2;
              if ((long *)*plVar5 == plVar6) {
                local_d0 = *plVar6;
                lStack_c8 = plVar5[3];
              }
              else {
                local_d0 = *plVar6;
                local_e0 = (long *)*plVar5;
              }
              local_d8 = plVar5[1];
              *plVar5 = (long)plVar6;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_e0,(ulong)(pSVar2->name)._M_dataplus._M_p);
              plVar6 = plVar5 + 2;
              if ((long *)*plVar5 == plVar6) {
                local_90 = *plVar6;
                lStack_88 = plVar5[3];
                local_a0 = &local_90;
              }
              else {
                local_90 = *plVar6;
                local_a0 = (long *)*plVar5;
              }
              local_98 = plVar5[1];
              *plVar5 = (long)plVar6;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
              local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
              psVar7 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar7) {
                local_100.field_2._M_allocated_capacity = *psVar7;
                local_100.field_2._8_8_ = plVar5[3];
              }
              else {
                local_100.field_2._M_allocated_capacity = *psVar7;
                local_100._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_100._M_string_length = plVar5[1];
              *plVar5 = (long)psVar7;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              if (local_a0 != &local_90) {
                operator_delete(local_a0,local_90 + 1);
              }
              if (local_e0 != &local_d0) {
                operator_delete(local_e0,local_d0 + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_68._M_dataplus._M_p != &local_68.field_2) {
                operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1
                               );
              }
              local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c0,local_100._M_dataplus._M_p,
                         local_100._M_dataplus._M_p + local_100._M_string_length);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_48,__return_storage_ptr__);
              bVar4 = inVector(&local_c0,&local_48);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1
                               );
              }
              if (!bVar4) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string&>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           __return_storage_ptr__,&local_100);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              pbVar8 = pbVar8 + 1;
            } while (pbVar8 != pbVar1);
          }
          local_108 = local_108 + 1;
        } while (local_108 != local_78);
      }
      local_118 = local_118 + 1;
    } while (local_118 != local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> PDA::getCFGVariables() {

    std::vector<std::string> variables = {"S"};

    for (State* stateP: statesQ){
        for (State* stateQ: statesQ){
            for(std::string inputX: stackAlphabetG){ // TODO: Check whether stackAlphabetG contains all elements  of the alphabet
                std::string variableName = "[" + stateP->getName() + inputX + stateQ->getName() + "]";
                if(!inVector(variableName, variables)){
                    variables.emplace_back(variableName);
                }
            }
        }
    }

    return variables;
}